

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::objectivec::FilePathBasename_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FileDescriptor *file)

{
  string basename;
  string directory;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  anon_unknown_0::PathSplit(*(string **)this,&local_50,&local_90);
  StripProto(&local_70,&local_90);
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  anon_unknown_0::UnderscoresToCamelCase(&local_70,&local_90,true);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string FilePathBasename(const FileDescriptor* file) {
  string output;
  string basename;
  string directory;
  PathSplit(file->name(), &directory, &basename);
  basename = StripProto(basename);

  // CamelCase to be more ObjC friendly.
  output = UnderscoresToCamelCase(basename, true);

  return output;
}